

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

time_t zip_time(char *p)

{
  time_t tVar1;
  byte *in_RDI;
  tm_conflict ts;
  wchar_t msDate;
  wchar_t msTime;
  tm local_48;
  uint local_10;
  uint local_c;
  
  local_c = (uint)*in_RDI + (uint)in_RDI[1] * 0x100;
  local_10 = (uint)in_RDI[2] + (uint)in_RDI[3] * 0x100;
  memset(&local_48,0,0x38);
  local_48.tm_year = ((int)local_10 >> 9 & 0x7fU) + 0x50;
  local_48.tm_mon = ((int)local_10 >> 5 & 0xfU) - 1;
  local_48.tm_mday = local_10 & 0x1f;
  local_48.tm_hour = (int)local_c >> 0xb & 0x1f;
  local_48.tm_min = (int)local_c >> 5 & 0x3f;
  local_48.tm_sec = (local_c & 0x1f) << 1;
  local_48.tm_isdst = -1;
  tVar1 = mktime(&local_48);
  return tVar1;
}

Assistant:

static time_t
zip_time(const char *p)
{
	int msTime, msDate;
	struct tm ts;

	msTime = (0xff & (unsigned)p[0]) + 256 * (0xff & (unsigned)p[1]);
	msDate = (0xff & (unsigned)p[2]) + 256 * (0xff & (unsigned)p[3]);

	memset(&ts, 0, sizeof(ts));
	ts.tm_year = ((msDate >> 9) & 0x7f) + 80; /* Years since 1900. */
	ts.tm_mon = ((msDate >> 5) & 0x0f) - 1; /* Month number. */
	ts.tm_mday = msDate & 0x1f; /* Day of month. */
	ts.tm_hour = (msTime >> 11) & 0x1f;
	ts.tm_min = (msTime >> 5) & 0x3f;
	ts.tm_sec = (msTime << 1) & 0x3e;
	ts.tm_isdst = -1;
	return mktime(&ts);
}